

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  bool bVar2;
  FILE *__stream;
  ulong uVar3;
  int i;
  int index;
  char *pcVar4;
  pair<int,_int> *set;
  SetKey *set_00;
  bool bVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<const_std::pair<int,_int>,_int> pVar7;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  Hasher local_1f0;
  undefined1 local_1e0 [8];
  undefined8 *local_1d8;
  pair<int,_int> local_1d0;
  SetKey local_1c1;
  iterator local_1c0;
  undefined1 *local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  nonempty_iterator local_150;
  float local_148;
  float local_144;
  undefined1 local_140;
  undefined8 local_120;
  sparsetable<std::pair<std::pair<int,int>const,int>,(unsigned_short)48,Alloc<std::pair<std::pair<int,int>const,int>,unsigned_long,18446744073709551615ul>>
  local_118 [56];
  ulong local_e0;
  undefined **local_d0;
  undefined1 local_c8 [152];
  
  local_1c0.ht._0_4_ = 0;
  local_1c0.ht._4_4_ = 0;
  local_1c0.pos.row_begin._M_current._0_4_ = 0;
  local_1e0 = (undefined1  [8])0x0;
  local_1d8 = (undefined8 *)((ulong)local_1d8 & 0xffffffff00000000);
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  local_170._8_8_ =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c26a18;
  set = &local_1d0;
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(TransparentHasher *)&local_1c0,(TransparentHasher *)local_1e0,
                     (SelectKey *)&local_1f0,(SetKey *)set,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_170);
  local_d0 = &PTR__BaseHashtableInterface_00c26998;
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(2000);
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  local_c8[0x2a] = true;
  local_c8._60_4_ = pVar7.first.first;
  local_c8._64_4_ = pVar7.first.second;
  index = 1;
  do {
    pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(index);
    local_1c0.ht._0_4_ = pVar7.first.first;
    local_1c0.ht._4_4_ = pVar7.first.second;
    local_1c0.pos.row_begin._M_current._0_4_ = pVar7.second;
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8,1);
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_170,
                      (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_c8,(const_reference)&local_1c0);
    index = index + 1;
  } while (index != 100);
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x38);
  local_170._0_8_ = pVar7.first;
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x16);
  local_170._0_8_ = pVar7.first;
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  __stream = tmpfile();
  bVar5 = __stream != (FILE *)0x0;
  local_1c0.ht._0_4_ = CONCAT31(local_1c0.ht._1_3_,bVar5);
  local_1c0.pos.row_begin._M_current._0_4_ = 0;
  local_1c0.pos.row_begin._M_current._4_4_ = 0;
  if (!bVar5) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,(AssertionResult *)"fp != __null","false",
               "true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((undefined1 *)local_170._0_8_ != local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(local_1c0.pos.row_begin._M_current._4_4_,(int)local_1c0.pos.row_begin._M_current
                   );
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  bVar2 = google::
          sparsetable<std::pair<std::pair<int,int>const,int>,(unsigned_short)48,Alloc<std::pair<std::pair<int,int>const,int>,unsigned_long,18446744073709551615ul>>
          ::serialize<ValueSerializer,_IO_FILE>
                    ((sparsetable<std::pair<std::pair<int,int>const,int>,(unsigned_short)48,Alloc<std::pair<std::pair<int,int>const,int>,unsigned_long,18446744073709551615ul>>
                      *)(local_c8 + 0x50));
  local_1c0.ht._0_4_ = CONCAT31(local_1c0.ht._1_3_,bVar2);
  local_1c0.pos.row_begin._M_current._0_4_ = 0;
  local_1c0.pos.row_begin._M_current._4_4_ = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",
               (char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((undefined1 *)local_170._0_8_ != local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(local_1c0.pos.row_begin._M_current._4_4_,(int)local_1c0.pos.row_begin._M_current
                   );
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  rewind(__stream);
  local_1e0 = (undefined1  [8])0x0;
  local_1d8 = (undefined8 *)((ulong)local_1d8 & 0xffffffff00000000);
  local_1f0 = (Hasher)ZEXT812(0);
  local_1c0.ht._0_4_ = 0;
  local_1c0.pos.row_begin._M_current._0_4_ = 0;
  local_1c0.pos.row_begin._M_current._4_4_ = 0;
  this_00 = (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_170 + 8);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c26a18;
  set_00 = &local_1c1;
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_1e0,(TransparentHasher *)&local_1f0,
                     (SelectKey *)&local_1d0,set_00,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1c0);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c26998;
  local_1e0[0] = (internal)bVar5;
  local_1d8 = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,(AssertionResult *)"fp != __null","false",
               "true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((iterator *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != &local_1c0.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    }
    if ((long *)local_1f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_120 = 0;
  bVar5 = google::
          sparsetable<std::pair<std::pair<int,int>const,int>,(unsigned_short)48,Alloc<std::pair<std::pair<int,int>const,int>,unsigned_long,18446744073709551615ul>>
          ::unserialize<ValueSerializer,_IO_FILE>(local_118,__stream);
  local_148 = local_148 * (float)local_e0;
  uVar3 = (ulong)local_148;
  local_160._8_8_ = (long)(local_148 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  local_144 = (float)local_e0 * local_144;
  uVar3 = (ulong)local_144;
  local_150 = (nonempty_iterator)((long)(local_144 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3);
  local_140 = 0;
  local_1e0[0] = (internal)bVar5;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",
               (char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((iterator *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != &local_1c0.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    }
    if ((long *)local_1f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  fclose(__stream);
  local_1f0 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  local_1d0 = pVar7.first;
  google::
  sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1d0);
  local_178 = local_170;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_1e0,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<const_std::pair<int,_int>,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_1f0 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(99);
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(99);
  local_1d0 = pVar7.first;
  google::
  sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1d0);
  local_178 = local_170;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_1e0,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<const_std::pair<int,_int>,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(100);
  local_1c0.ht._0_4_ = pVar7.first.first;
  local_1c0.ht._4_4_ = pVar7.first.second;
  pVar6 = google::
          sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  bVar5 = pVar6.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar5;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)set_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((iterator *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != &local_1c0.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    }
    if ((pair<int,_int>)local_1f0._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_1f0 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x15);
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x15);
  local_1d0 = pVar7.first;
  google::
  sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            (&local_1c0,
             (sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,&local_1d0);
  local_178 = local_170;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_1e0,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<const_std::pair<int,_int>,_int> *)&local_1f0,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x16);
  local_1c0.ht._0_4_ = pVar7.first.first;
  local_1c0.ht._4_4_ = pVar7.first.second;
  pVar6 = google::
          sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  bVar5 = pVar6.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar5;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((iterator *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != &local_1c0.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    }
    if ((pair<int,_int>)local_1f0._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  pVar7 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x38);
  local_1c0.ht._0_4_ = pVar7.first.first;
  local_1c0.ht._4_4_ = pVar7.first.second;
  pVar6 = google::
          sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((sparse_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00,(pair<int,_int> *)&local_1c0);
  bVar5 = pVar6.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar5;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((iterator *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht) != &local_1c0.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_1c0.ht._4_4_,(int)local_1c0.ht));
    }
    if ((pair<int,_int>)local_1f0._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c26a18;
  std::
  vector<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_118);
  local_d0 = &PTR__BaseHashtableInterface_00c26a18;
  std::
  vector<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c8 + 0x50));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}